

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmcAnd.c
# Opt level: O1

int Gia_ManBmcAssignVarIds(Bmc_Mna_t *p,Vec_Int_t *vIns,Vec_Int_t *vUsed,Vec_Int_t *vOuts)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  Vec_Int_t *pVVar4;
  int *piVar5;
  bool bVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  
  iVar1 = p->nSatVars;
  p->nSatVars = iVar1 + 1;
  if (0 < vIns->nSize) {
    piVar3 = vIns->pArray;
    pVVar4 = p->vId2Var;
    lVar8 = 0;
    do {
      lVar9 = (long)piVar3[lVar8];
      if ((lVar9 < 0) || (pVVar4->nSize <= piVar3[lVar8])) goto LAB_005656cc;
      piVar5 = pVVar4->pArray;
      if (piVar5[lVar9] == 0) {
        iVar2 = p->nSatVars;
        p->nSatVars = iVar2 + 1;
        piVar5[lVar9] = iVar2;
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < vIns->nSize);
  }
  lVar8 = (long)vUsed->nSize;
  if (0 < (long)vUsed->nSize) {
    do {
      if (vUsed->nSize < lVar8) goto LAB_005656cc;
      lVar9 = (long)vUsed->pArray[lVar8 + -1];
      if ((lVar9 < 0) || (p->vId2Var->nSize <= vUsed->pArray[lVar8 + -1])) goto LAB_005656cc;
      piVar3 = p->vId2Var->pArray;
      if (piVar3[lVar9] != 0) {
        __assert_fail("Vec_IntEntry( p->vId2Var, iObj ) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcBmcAnd.c"
                      ,0x1db,
                      "int Gia_ManBmcAssignVarIds(Bmc_Mna_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                     );
      }
      iVar2 = p->nSatVars;
      p->nSatVars = iVar2 + 1;
      piVar3[lVar9] = iVar2;
      bVar6 = 1 < lVar8;
      lVar8 = lVar8 + -1;
    } while (bVar6);
  }
  if (0 < vOuts->nSize) {
    piVar3 = vOuts->pArray;
    pVVar4 = p->vId2Var;
    lVar8 = 0;
    do {
      lVar9 = (long)piVar3[lVar8];
      if ((lVar9 < 0) || (pVVar4->nSize <= piVar3[lVar8])) {
LAB_005656cc:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      piVar5 = pVVar4->pArray;
      if (piVar5[lVar9] != 0) {
        __assert_fail("Vec_IntEntry( p->vId2Var, iObj ) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcBmcAnd.c"
                      ,0x1e0,
                      "int Gia_ManBmcAssignVarIds(Bmc_Mna_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                     );
      }
      iVar2 = p->nSatVars;
      p->nSatVars = iVar2 + 1;
      piVar5[lVar9] = iVar2;
      lVar8 = lVar8 + 1;
    } while (lVar8 < vOuts->nSize);
  }
  iVar2 = p->nSatVars;
  iVar7 = sat_solver_nvars(p->pSat);
  if (iVar7 < iVar2) {
    sat_solver_setnvars(p->pSat,p->nSatVars);
  }
  return iVar1;
}

Assistant:

int Gia_ManBmcAssignVarIds( Bmc_Mna_t * p, Vec_Int_t * vIns, Vec_Int_t * vUsed, Vec_Int_t * vOuts )
{
    int i, iObj = 0, VarC0 = p->nSatVars++;
    Vec_IntForEachEntry( vIns, iObj, i )
        if ( Vec_IntEntry( p->vId2Var, iObj ) == 0 )
            Vec_IntWriteEntry( p->vId2Var, iObj, p->nSatVars++ );
    Vec_IntForEachEntryReverse( vUsed, iObj, i )
    {
        assert( Vec_IntEntry( p->vId2Var, iObj ) == 0 );
        Vec_IntWriteEntry( p->vId2Var, iObj, p->nSatVars++ );
    }
    Vec_IntForEachEntry( vOuts, iObj, i )
    {
        assert( Vec_IntEntry( p->vId2Var, iObj ) == 0 );
        Vec_IntWriteEntry( p->vId2Var, iObj, p->nSatVars++ );
    }
    // extend the SAT solver
    if ( p->nSatVars > sat_solver_nvars(p->pSat) )
        sat_solver_setnvars( p->pSat, p->nSatVars );
    return VarC0;
}